

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listelem_alloc.c
# Opt level: O1

void * listelem_get_item(listelem_alloc_t *list,int32 id)

{
  listelem_alloc_t *plVar1;
  int iVar2;
  
  iVar2 = (int)list->n_blocks - ((uint)id >> 0x10);
  plVar1 = list;
  do {
    plVar1 = (listelem_alloc_t *)plVar1->blocks;
    if (plVar1 == (listelem_alloc_t *)0x0) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/listelem_alloc.c"
              ,0xf9,"Failed to find block index %d\n");
      return (void *)0x0;
    }
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  return (void *)((list->elemsize >> 3) * ((ulong)(uint)id & 0xffff) * 8 +
                 (long)((anytype_t *)&plVar1->freelist)->ptr);
}

Assistant:

void *
listelem_get_item(listelem_alloc_t *list, int32 id)
{
    int32 blkidx, ptridx, i;
    gnode_t *gn;

    blkidx = (id >> BLKID_SHIFT) & BLKID_MASK;
    ptridx = id & BLKID_MASK;

    i = 0;
    blkidx = list->n_blocks - blkidx;
    for (gn = list->blocks; gn; gn = gnode_next(gn)) {
        if (++i == blkidx)
            break;
    }
    if (gn == NULL) {
        E_ERROR("Failed to find block index %d\n", blkidx);
        return NULL;
    }

    return (void *)((char **)gnode_ptr(gn)
                    + ptridx * (list->elemsize / sizeof(void *)));
}